

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::compare(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  uint uVar2;
  uint src_00;
  int iVar3;
  string Word2;
  string Word1;
  
  requireDStackDepth(this,4,"COMPARE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src_00 = ForthStack<unsigned_int>::getTop(this_00);
  Word1._M_dataplus._M_p = (pointer)&Word1.field_2;
  Word1._M_string_length = 0;
  Word1.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&Word1,src_00,(ulong)uVar2);
  Word2._M_dataplus._M_p = (pointer)&Word2.field_2;
  Word2._M_string_length = 0;
  Word2.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&Word2,src,(ulong)uVar1);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&Word1,&Word2);
  uVar1 = 0xffffffff;
  if (-1 < iVar3) {
    uVar1 = (uint)(iVar3 != 0);
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar1);
  std::__cxx11::string::~string((string *)&Word2);
  std::__cxx11::string::~string((string *)&Word1);
  return;
}

Assistant:

void compare(){
			REQUIRE_DSTACK_DEPTH(4, "COMPARE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); pop();
			auto length1 = dStack.getTop(); pop();
			auto caddr1 = CADDR(dStack.getTop()); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.compare(Word2);
			dStack.setTop((result < 0) ? -1 : ((result > 0) ? 1 : 0)); 
		}